

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionInfo.cpp
# Opt level: O0

PositionInfo * __thiscall PositionInfo::GetStringPosition_abi_cxx11_(PositionInfo *this)

{
  int *in_RSI;
  __cxx11 local_110 [32];
  __cxx11 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  __cxx11 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  __cxx11 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [54];
  allocator local_1a;
  undefined1 local_19;
  PositionInfo *this_local;
  string *result;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"\"(",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::__cxx11::to_string(local_70,*in_RSI);
  std::operator+(local_50,(char *)local_70);
  std::__cxx11::string::operator+=((string *)this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::to_string(local_b0,in_RSI[2]);
  std::operator+(local_90,(char *)local_b0);
  std::__cxx11::string::operator+=((string *)this,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::to_string(local_f0,in_RSI[1]);
  std::operator+(local_d0,(char *)local_f0);
  std::__cxx11::string::operator+=((string *)this,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::to_string(local_110,in_RSI[3]);
  std::__cxx11::string::operator+=((string *)this,(string *)local_110);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::operator+=((string *)this,")\"");
  return this;
}

Assistant:

std::string PositionInfo::GetStringPosition() const {
	std::string result = "\"(";
	result += std::to_string(firstLine) + ",";
	result += std::to_string(firstColumn) + ") : (";
	result += std::to_string(lastLine) + ",";
	result += std::to_string(lastColumn);
	result += ")\"";
	return result;
}